

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_avx2.c
# Opt level: O0

void resize_convolve(__m256i *s,__m256i *coeffs,__m256i *res_out)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  __m256i dst_11;
  __m256i dst_10;
  __m256i dst_01;
  __m256i dst_00;
  __m256i dst_1;
  __m256i dst_0;
  __m256i res_3;
  __m256i res_2;
  __m256i res_1;
  __m256i res_0;
  undefined1 local_50 [16];
  
  auVar1 = vpmaddubsw_avx2(*in_RDI,*in_RSI);
  auVar2 = vpmaddubsw_avx2(in_RDI[1],in_RSI[1]);
  auVar3 = vpmaddubsw_avx2(in_RDI[2],in_RSI[2]);
  auVar4 = vpmaddubsw_avx2(in_RDI[3],in_RSI[3]);
  auVar1 = vpaddw_avx2(auVar1,auVar2);
  auVar2 = vpaddw_avx2(auVar3,auVar4);
  auVar1 = vpmovsxwd_avx2(auVar1._0_16_);
  auVar3 = vpmovsxwd_avx2(local_50);
  auVar4 = vpmovsxwd_avx2(auVar2._0_16_);
  auVar2 = vpmovsxwd_avx2(auVar2._16_16_);
  auVar1 = vpaddd_avx2(auVar1,auVar4);
  *in_RDX = auVar1;
  auVar1 = vpaddd_avx2(auVar3,auVar2);
  in_RDX[1] = auVar1;
  return;
}

Assistant:

static inline void resize_convolve(const __m256i *const s,
                                   const __m256i *const coeffs,
                                   __m256i *res_out) {
  const __m256i res_0 = _mm256_maddubs_epi16(s[0], coeffs[0]);
  const __m256i res_1 = _mm256_maddubs_epi16(s[1], coeffs[1]);
  const __m256i res_2 = _mm256_maddubs_epi16(s[2], coeffs[2]);
  const __m256i res_3 = _mm256_maddubs_epi16(s[3], coeffs[3]);

  const __m256i dst_0 = _mm256_add_epi16(res_0, res_1);
  const __m256i dst_1 = _mm256_add_epi16(res_2, res_3);
  // The sum of convolve operation crosses signed 16bit. Hence, the addition
  // should happen in 32bit.
  const __m256i dst_00 = _mm256_cvtepi16_epi32(CAST_LOW(dst_0));
  const __m256i dst_01 =
      _mm256_cvtepi16_epi32(_mm256_extracti128_si256(dst_0, 1));
  const __m256i dst_10 = _mm256_cvtepi16_epi32(CAST_LOW(dst_1));
  const __m256i dst_11 =
      _mm256_cvtepi16_epi32(_mm256_extracti128_si256(dst_1, 1));

  res_out[0] = _mm256_add_epi32(dst_00, dst_10);
  res_out[1] = _mm256_add_epi32(dst_01, dst_11);
}